

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# makeTiled.cpp
# Opt level: O2

void anon_unknown.dwarf_1b803::reduceY
               (ChannelList *channels,
               set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *doNotFilter,Extrapolation ext,bool odd,Image *image0,Image *image1)

{
  _Rb_tree_color _Var1;
  Image *pIVar2;
  Image *pIVar3;
  long lVar4;
  float *pfVar5;
  long lVar6;
  float *pfVar7;
  half *phVar8;
  half *phVar9;
  uint *puVar10;
  uint *puVar11;
  _Rb_tree_node_base *p_Var12;
  _Rb_tree_node_base *p_Var13;
  const_iterator cVar14;
  TypedImageChannel<float> *channel;
  TypedImageChannel<float> *pTVar15;
  long lVar16;
  TypedImageChannel<Imath_3_2::half> *channel_00;
  TypedImageChannel<Imath_3_2::half> *pTVar17;
  TypedImageChannel<unsigned_int> *channel_01;
  TypedImageChannel<unsigned_int> *pTVar18;
  undefined7 in_register_00000009;
  long lVar19;
  ulong uVar20;
  int x;
  int iVar21;
  int iVar22;
  int iVar23;
  uint uVar24;
  ulong uVar25;
  uint uVar26;
  double dVar27;
  allocator<char> local_f9;
  double local_f8;
  half local_ea;
  double local_e8;
  long local_e0;
  undefined4 local_d8;
  allocator<char> local_d1;
  _Rb_tree_node_base *local_d0;
  ulong local_c8;
  ulong local_c0;
  double local_b8;
  double local_b0;
  double local_a8;
  double local_a0;
  _Base_ptr local_98;
  Image *local_90;
  Image *local_88;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_80;
  ChannelList *local_78;
  key_type local_70;
  string local_50;
  
  local_d8 = (undefined4)CONCAT71(in_register_00000009,odd);
  local_90 = image1;
  local_88 = image0;
  local_78 = channels;
  p_Var12 = (_Rb_tree_node_base *)Imf_3_4::ChannelList::begin();
  local_98 = &(doNotFilter->_M_t)._M_impl.super__Rb_tree_header._M_header;
  local_80 = &doNotFilter->_M_t;
  do {
    p_Var13 = (_Rb_tree_node_base *)Imf_3_4::ChannelList::end();
    if (p_Var12 == p_Var13) {
      return;
    }
    p_Var13 = p_Var12 + 1;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_70,(char *)p_Var13,(allocator<char> *)&local_50);
    cVar14 = std::
             _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::find(local_80,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    _Var1 = p_Var12[9]._M_color;
    if (_Var1 == _S_red) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_70,(char *)p_Var13,(allocator<char> *)&local_ea);
      channel_01 = Image::typedChannel<unsigned_int>(local_88,&local_70);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_50,(char *)p_Var13,&local_f9);
      local_d0 = p_Var12;
      pTVar18 = Image::typedChannel<unsigned_int>(local_90,&local_50);
      pIVar2 = (pTVar18->super_ImageChannel)._image;
      uVar26 = ((pIVar2->_dataWindow).max.x - (pIVar2->_dataWindow).min.x) + 1;
      pIVar3 = (channel_01->super_ImageChannel)._image;
      iVar21 = (pIVar3->_dataWindow).max.y - (pIVar3->_dataWindow).min.y;
      iVar22 = iVar21 + 1;
      iVar23 = (pIVar2->_dataWindow).max.y - (pIVar2->_dataWindow).min.y;
      uVar24 = iVar23 + 1;
      if (cVar14._M_node == local_98) {
        local_e8 = 1.0;
        if (1 < (int)uVar24) {
          local_e8 = (double)(iVar21 + -1) / (double)iVar23;
        }
        if ((int)uVar26 < 1) {
          uVar26 = 0;
        }
        if ((int)uVar24 < 1) {
          uVar24 = 0;
        }
        local_c8 = (ulong)uVar24;
        local_e0 = 0;
        uVar20 = 0;
        while (uVar20 != local_c8) {
          local_a0 = (double)(int)uVar20 * local_e8;
          local_a8 = local_a0 + -1.0;
          local_b0 = local_a0 + 1.0;
          local_b8 = local_a0 + 2.0;
          local_c0 = uVar20;
          for (uVar25 = 0; uVar26 != uVar25; uVar25 = uVar25 + 1) {
            iVar21 = (int)uVar25;
            local_f8 = sampleY<unsigned_int>(channel_01,iVar22,iVar21,local_a8,ext);
            dVar27 = sampleY<unsigned_int>(channel_01,iVar22,iVar21,local_a0,ext);
            local_f8 = local_f8 * 0.125 + dVar27 * 0.375;
            dVar27 = sampleY<unsigned_int>(channel_01,iVar22,iVar21,local_b0,ext);
            local_f8 = dVar27 * 0.375 + local_f8;
            dVar27 = sampleY<unsigned_int>(channel_01,iVar22,iVar21,local_b8,ext);
            *(int *)((long)(pTVar18->_pixels)._data +
                    uVar25 * 4 + (pTVar18->_pixels)._sizeY * local_e0) =
                 (int)(long)(dVar27 * 0.125 + local_f8);
          }
          local_e0 = local_e0 + 4;
          uVar20 = local_c0 + 1;
        }
      }
      else {
        if ((int)uVar26 < 1) {
          uVar26 = 0;
        }
        lVar16 = (long)(int)(iVar22 + uVar24 * -2 + 1);
        if ((char)local_d8 == '\0') {
          lVar16 = 0;
        }
        if ((int)uVar24 < 1) {
          uVar24 = 0;
        }
        lVar16 = lVar16 << 2;
        lVar19 = 0;
        for (uVar20 = 0; uVar20 != uVar24; uVar20 = uVar20 + 1) {
          lVar4 = (pTVar18->_pixels)._sizeY;
          puVar10 = (pTVar18->_pixels)._data;
          lVar6 = (channel_01->_pixels)._sizeY;
          puVar11 = (channel_01->_pixels)._data;
          for (uVar25 = 0; uVar26 != uVar25; uVar25 = uVar25 + 1) {
            *(undefined4 *)((long)puVar10 + uVar25 * 4 + lVar4 * lVar19) =
                 *(undefined4 *)((long)puVar11 + uVar25 * 4 + lVar6 * lVar16);
          }
          lVar19 = lVar19 + 4;
          lVar16 = lVar16 + 8;
        }
      }
LAB_00108269:
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&local_70);
      p_Var12 = local_d0;
    }
    else {
      if (_Var1 == _S_black) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_70,(char *)p_Var13,&local_f9);
        channel_00 = Image::typedChannel<Imath_3_2::half>(local_88,&local_70);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_50,(char *)p_Var13,&local_d1);
        local_d0 = p_Var12;
        pTVar17 = Image::typedChannel<Imath_3_2::half>(local_90,&local_50);
        pIVar2 = (pTVar17->super_ImageChannel)._image;
        uVar26 = ((pIVar2->_dataWindow).max.x - (pIVar2->_dataWindow).min.x) + 1;
        pIVar3 = (channel_00->super_ImageChannel)._image;
        iVar21 = (pIVar3->_dataWindow).max.y - (pIVar3->_dataWindow).min.y;
        iVar22 = iVar21 + 1;
        iVar23 = (pIVar2->_dataWindow).max.y - (pIVar2->_dataWindow).min.y;
        uVar24 = iVar23 + 1;
        if (cVar14._M_node == local_98) {
          local_e8 = 1.0;
          if (1 < (int)uVar24) {
            local_e8 = (double)(iVar21 + -1) / (double)iVar23;
          }
          if ((int)uVar26 < 1) {
            uVar26 = 0;
          }
          if ((int)uVar24 < 1) {
            uVar24 = 0;
          }
          local_c8 = (ulong)uVar24;
          local_e0 = 0;
          uVar20 = 0;
          while (uVar20 != local_c8) {
            local_a0 = (double)(int)uVar20 * local_e8;
            local_a8 = local_a0 + -1.0;
            local_b0 = local_a0 + 1.0;
            local_b8 = local_a0 + 2.0;
            local_c0 = uVar20;
            for (uVar25 = 0; uVar26 != uVar25; uVar25 = uVar25 + 1) {
              iVar21 = (int)uVar25;
              local_f8 = sampleY<Imath_3_2::half>(channel_00,iVar22,iVar21,local_a8,ext);
              dVar27 = sampleY<Imath_3_2::half>(channel_00,iVar22,iVar21,local_a0,ext);
              local_f8 = local_f8 * 0.125 + dVar27 * 0.375;
              dVar27 = sampleY<Imath_3_2::half>(channel_00,iVar22,iVar21,local_b0,ext);
              local_f8 = dVar27 * 0.375 + local_f8;
              dVar27 = sampleY<Imath_3_2::half>(channel_00,iVar22,iVar21,local_b8,ext);
              Imath_3_2::half::half(&local_ea,(float)(dVar27 * 0.125 + local_f8));
              *(uint16_t *)
               ((long)&(pTVar17->_pixels)._data[uVar25]._h + (pTVar17->_pixels)._sizeY * local_e0) =
                   local_ea._h;
            }
            local_e0 = local_e0 + 2;
            uVar20 = local_c0 + 1;
          }
        }
        else {
          if ((int)uVar26 < 1) {
            uVar26 = 0;
          }
          lVar16 = (long)(int)(iVar22 + uVar24 * -2 + 1);
          if ((char)local_d8 == '\0') {
            lVar16 = 0;
          }
          if ((int)uVar24 < 1) {
            uVar24 = 0;
          }
          lVar16 = lVar16 * 2;
          lVar19 = 0;
          for (uVar20 = 0; uVar20 != uVar24; uVar20 = uVar20 + 1) {
            lVar4 = (pTVar17->_pixels)._sizeY;
            phVar8 = (pTVar17->_pixels)._data;
            lVar6 = (channel_00->_pixels)._sizeY;
            phVar9 = (channel_00->_pixels)._data;
            for (uVar25 = 0; uVar26 != uVar25; uVar25 = uVar25 + 1) {
              *(uint16_t *)((long)&phVar8[uVar25]._h + lVar4 * lVar19) =
                   *(uint16_t *)((long)&phVar9[uVar25]._h + lVar6 * lVar16);
            }
            lVar19 = lVar19 + 2;
            lVar16 = lVar16 + 4;
          }
        }
        goto LAB_00108269;
      }
      if (_Var1 == 2) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_70,(char *)p_Var13,(allocator<char> *)&local_ea);
        channel = Image::typedChannel<float>(local_88,&local_70);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_50,(char *)p_Var13,&local_f9);
        local_d0 = p_Var12;
        pTVar15 = Image::typedChannel<float>(local_90,&local_50);
        pIVar2 = (pTVar15->super_ImageChannel)._image;
        uVar26 = ((pIVar2->_dataWindow).max.x - (pIVar2->_dataWindow).min.x) + 1;
        pIVar3 = (channel->super_ImageChannel)._image;
        iVar21 = (pIVar3->_dataWindow).max.y - (pIVar3->_dataWindow).min.y;
        iVar22 = iVar21 + 1;
        iVar23 = (pIVar2->_dataWindow).max.y - (pIVar2->_dataWindow).min.y;
        uVar24 = iVar23 + 1;
        if (cVar14._M_node == local_98) {
          local_e8 = 1.0;
          if (1 < (int)uVar24) {
            local_e8 = (double)(iVar21 + -1) / (double)iVar23;
          }
          if ((int)uVar26 < 1) {
            uVar26 = 0;
          }
          if ((int)uVar24 < 1) {
            uVar24 = 0;
          }
          local_c8 = (ulong)uVar24;
          local_e0 = 0;
          uVar20 = 0;
          while (uVar20 != local_c8) {
            local_a0 = (double)(int)uVar20 * local_e8;
            local_a8 = local_a0 + -1.0;
            local_b0 = local_a0 + 1.0;
            local_b8 = local_a0 + 2.0;
            local_c0 = uVar20;
            for (uVar25 = 0; uVar26 != uVar25; uVar25 = uVar25 + 1) {
              iVar21 = (int)uVar25;
              local_f8 = sampleY<float>(channel,iVar22,iVar21,local_a8,ext);
              dVar27 = sampleY<float>(channel,iVar22,iVar21,local_a0,ext);
              local_f8 = local_f8 * 0.125 + dVar27 * 0.375;
              dVar27 = sampleY<float>(channel,iVar22,iVar21,local_b0,ext);
              local_f8 = dVar27 * 0.375 + local_f8;
              dVar27 = sampleY<float>(channel,iVar22,iVar21,local_b8,ext);
              *(float *)((long)(pTVar15->_pixels)._data +
                        uVar25 * 4 + (pTVar15->_pixels)._sizeY * local_e0) =
                   (float)(dVar27 * 0.125 + local_f8);
            }
            local_e0 = local_e0 + 4;
            uVar20 = local_c0 + 1;
          }
        }
        else {
          if ((int)uVar26 < 1) {
            uVar26 = 0;
          }
          lVar16 = (long)(int)(iVar22 + uVar24 * -2 + 1);
          if ((char)local_d8 == '\0') {
            lVar16 = 0;
          }
          if ((int)uVar24 < 1) {
            uVar24 = 0;
          }
          lVar16 = lVar16 << 2;
          lVar19 = 0;
          for (uVar20 = 0; uVar20 != uVar24; uVar20 = uVar20 + 1) {
            lVar4 = (pTVar15->_pixels)._sizeY;
            pfVar5 = (pTVar15->_pixels)._data;
            lVar6 = (channel->_pixels)._sizeY;
            pfVar7 = (channel->_pixels)._data;
            for (uVar25 = 0; uVar26 != uVar25; uVar25 = uVar25 + 1) {
              *(undefined4 *)((long)pfVar5 + uVar25 * 4 + lVar4 * lVar19) =
                   *(undefined4 *)((long)pfVar7 + uVar25 * 4 + lVar6 * lVar16);
            }
            lVar19 = lVar19 + 4;
            lVar16 = lVar16 + 8;
          }
        }
        goto LAB_00108269;
      }
    }
    p_Var12 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var12);
  } while( true );
}

Assistant:

void
reduceY (
    const ChannelList& channels,
    const set<string>& doNotFilter,
    Extrapolation      ext,
    bool               odd,
    const Image&       image0,
    Image&             image1)
{
    //
    // Shrink image image0 vertically by a factor of 2,
    // and store the result in image image1.
    //

    for (ChannelList::ConstIterator i = channels.begin (); i != channels.end ();
         ++i)
    {
        const char*    name    = i.name ();
        const Channel& channel = i.channel ();
        bool           filter = (doNotFilter.find (name) == doNotFilter.end ());

        switch (channel.type)
        {
            case IMF::HALF:

                reduceY (
                    image0.typedChannel<half> (name),
                    image1.typedChannel<half> (name),
                    filter,
                    ext,
                    odd);
                break;

            case IMF::FLOAT:

                reduceY (
                    image0.typedChannel<float> (name),
                    image1.typedChannel<float> (name),
                    filter,
                    ext,
                    odd);
                break;

            case IMF::UINT:

                reduceY (
                    image0.typedChannel<unsigned int> (name),
                    image1.typedChannel<unsigned int> (name),
                    filter,
                    ext,
                    odd);
                break;
            default: break;
        }
    }
}